

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O2

void __thiscall
spatial_region::fill_cell_by_particles
          (spatial_region *this,double cmr,int_vector3d *a,int_vector3d *b,double n,double ux0,
          double uy0,double dsplmt,double T)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  cellp *pcVar7;
  double dVar8;
  double dVar9;
  ulong uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  bool bVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar18;
  particle *p;
  int iVar19;
  int iVar20;
  int iVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  double dVar25;
  undefined1 auVar32 [16];
  double dVar26;
  undefined1 auVar33 [16];
  double dVar27;
  double dVar28;
  double dVar29;
  undefined1 auVar34 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  double __x;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 in_register_00001288 [56];
  undefined1 auVar48 [64];
  undefined1 auVar49 [16];
  undefined1 in_register_000012c8 [56];
  undefined1 auVar50 [64];
  double dVar51;
  double dVar52;
  undefined1 in_register_00001348 [56];
  undefined1 auVar53 [64];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined8 in_XMM9_Qb;
  undefined8 uVar59;
  double local_d8;
  double dStack_d0;
  double local_68;
  double dStack_60;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  auVar53._8_56_ = in_register_00001348;
  auVar53._0_8_ = T;
  auVar50._8_56_ = in_register_000012c8;
  auVar50._0_8_ = uy0;
  auVar48._8_56_ = in_register_00001288;
  auVar48._0_8_ = ux0;
  auVar35._8_56_ = in_register_00001208;
  auVar35._0_8_ = cmr;
  iVar19 = b->i;
  iVar21 = b->j;
  iVar18 = b->k;
  auVar44 = auVar48._0_16_;
  auVar30 = auVar35._0_16_;
  auVar54._0_8_ = 0.5 / (double)iVar21;
  auVar54._8_8_ = 0;
  dVar51 = (double)iVar18;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = 0.5 / (double)iVar19 + dsplmt;
  auVar54 = vunpcklpd_avx(auVar57,auVar54);
  iVar20 = 0;
  auVar39 = ZEXT816(0);
  uVar11 = vcmpsd_avx512f(auVar30,auVar39,1);
  bVar13 = (bool)((byte)uVar11 & 1);
  dVar8 = (1.0 / (double)(iVar21 * iVar19 * iVar18)) * n;
  auVar15._8_8_ = 0x8000000000000000;
  auVar15._0_8_ = 0x8000000000000000;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar8;
  auVar22 = vxorpd_avx512vl(auVar22,auVar15);
  uVar11 = vcmppd_avx512vl(auVar30,auVar39,4);
  uVar10 = vcmppd_avx512vl(auVar53._0_16_,auVar39,4);
  uVar12 = vcmpsd_avx512f(auVar30,auVar39,4);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uy0 * uy0;
  auVar15 = vfmadd231sd_fma(auVar30,auVar44,auVar44);
  auVar44 = vunpcklpd_avx(auVar44,auVar50._0_16_);
  auVar15 = vsqrtsd_avx(auVar15,auVar15);
  auVar30 = vfmadd213sd_fma(auVar15,auVar15,ZEXT816(0x3ff0000000000000));
  dVar52 = auVar15._0_8_;
  auVar30 = vsqrtsd_avx(auVar30,auVar30);
  auVar39._0_8_ = dVar52 / auVar30._0_8_;
  auVar39._8_8_ = auVar15._8_8_;
  auVar30 = vfnmadd213sd_fma(auVar39,auVar39,ZEXT816(0x3ff0000000000000));
  auVar15 = vsqrtsd_avx(auVar30,auVar30);
  __x = auVar30._0_8_;
  auVar30 = vsqrtsd_avx(auVar30,auVar30);
  for (; iVar20 < iVar19; iVar20 = iVar20 + 1) {
    uVar59 = in_XMM9_Qb;
    for (iVar19 = 0; iVar19 < iVar21; iVar19 = iVar19 + 1) {
      auVar23._8_8_ = in_XMM9_Qb;
      auVar23._0_8_ = (double)iVar20;
      auVar31._0_8_ = (double)iVar19;
      auVar31._8_8_ = uVar59;
      iVar21 = 0;
      auVar57 = vunpcklpd_avx(auVar23,auVar31);
      for (; iVar21 < iVar18; iVar21 = iVar21 + 1) {
        p = new_particle(this);
        p->cmr = cmr;
        p->q = (double)((ulong)bVar13 * auVar22._0_8_ + (ulong)!bVar13 * (long)dVar8);
        uVar1 = b->i;
        uVar3 = b->j;
        auVar5._4_4_ = uVar3;
        auVar5._0_4_ = uVar1;
        auVar5._8_8_ = 0;
        auVar23 = vcvtdq2pd_avx(auVar5);
        uVar2 = a->i;
        uVar4 = a->j;
        auVar6._4_4_ = uVar4;
        auVar6._0_4_ = uVar2;
        auVar6._8_8_ = 0;
        auVar31 = vcvtdq2pd_avx(auVar6);
        local_68 = auVar54._0_8_;
        dStack_60 = auVar54._8_8_;
        auVar23 = vdivpd_avx(auVar57,auVar23);
        p->x = auVar31._0_8_ + local_68 + auVar23._0_8_;
        p->y = auVar31._8_8_ + dStack_60 + auVar23._8_8_;
        p->z = (double)a->k + 0.5 / dVar51 + (double)iVar21 / (double)b->k;
        if ((((byte)uVar11 & 3) & uVar10 & 1) == 0) {
          p->ux = ux0;
          p->uy = uy0;
          auVar34 = ZEXT816(0) << 0x40;
          auVar23 = auVar44;
        }
        else {
          do {
            dVar25 = get_rand(this);
            auVar40._8_8_ = 0;
            auVar40._0_8_ = dVar25 * 5.0;
            auVar23 = vfmadd213sd_fma(auVar40,auVar53._0_16_,ZEXT816(0x3ff0000000000000));
            dVar27 = auVar23._0_8_;
            dVar25 = get_rand(this);
            auVar16._8_8_ = 0x8000000000000000;
            auVar16._0_8_ = 0x8000000000000000;
            auVar32._8_8_ = 0;
            auVar32._0_8_ = dVar27 + -1.0;
            auVar23 = vxorpd_avx512vl(auVar32,auVar16);
            dVar26 = exp(auVar23._0_8_ / T);
          } while (dVar26 < dVar25);
          do {
            do {
              auVar36._0_8_ = get_rand(this);
              auVar36._8_56_ = extraout_var;
              auVar31 = vfmadd213sd_fma(auVar36._0_16_,ZEXT816(0x4000000000000000),
                                        ZEXT816(0xbff0000000000000));
              auVar37._0_8_ = get_rand(this);
              auVar37._8_56_ = extraout_var_00;
              auVar23 = vfmadd213sd_fma(auVar37._0_16_,ZEXT816(0x4000000000000000),
                                        ZEXT816(0xbff0000000000000));
              dVar25 = auVar23._0_8_;
              auVar38._0_8_ = get_rand(this);
              auVar38._8_56_ = extraout_var_01;
              auVar45._8_8_ = 0;
              auVar45._0_8_ = auVar31._0_8_;
              auVar5 = vfmadd213sd_fma(auVar38._0_16_,ZEXT816(0x4000000000000000),
                                       ZEXT816(0xbff0000000000000));
              auVar41._8_8_ = 0;
              auVar41._0_8_ = dVar25 * dVar25;
              auVar23 = vfmadd231sd_fma(auVar41,auVar45,auVar45);
              auVar23 = vfmadd231sd_fma(auVar23,auVar5,auVar5);
              auVar23 = vsqrtsd_avx(auVar23,auVar23);
              dVar26 = auVar23._0_8_;
            } while (1.0 < dVar26);
          } while ((dVar26 == 0.0) && (!NAN(dVar26)));
          dVar27 = 1.0 - 1.0 / (dVar27 * dVar27);
          if (dVar27 < 0.0) {
            dVar27 = sqrt(dVar27);
          }
          else {
            auVar33._8_8_ = 0;
            auVar33._0_8_ = dVar27;
            auVar23 = vsqrtsd_avx(auVar33,auVar33);
            dVar27 = auVar23._0_8_;
          }
          dVar28 = auVar15._0_8_;
          if (__x < 0.0) {
            dVar28 = sqrt(__x);
          }
          auVar58._8_8_ = 0;
          auVar58._0_8_ = auVar39._0_8_;
          dVar9 = (auVar31._0_8_ / dVar26) * dVar27;
          auVar56._8_8_ = 0;
          auVar56._0_8_ = dVar9;
          auVar23 = vfmadd213sd_fma(auVar58,auVar56,ZEXT816(0x3ff0000000000000));
          dVar14 = auVar23._0_8_;
          dVar29 = auVar30._0_8_;
          if (__x < 0.0) {
            dVar29 = sqrt(__x);
          }
          auVar55._0_8_ = ((auVar5._0_8_ / dVar26) * dVar27 * dVar29) / dVar14;
          auVar55._8_8_ = 0;
          auVar46._0_8_ = ((dVar25 / dVar26) * dVar27 * dVar28) / dVar14;
          auVar46._8_8_ = 0;
          auVar42._0_8_ = (dVar9 + auVar39._0_8_) / dVar14;
          auVar42._8_8_ = 0;
          auVar23 = vfnmadd213sd_fma(auVar42,auVar42,ZEXT816(0x3ff0000000000000));
          auVar23 = vfnmadd231sd_fma(auVar23,auVar46,auVar46);
          auVar23 = vfnmadd231sd_fma(auVar23,auVar55,auVar55);
          if (auVar23._0_8_ < 0.0) {
            dVar25 = sqrt(auVar23._0_8_);
          }
          else {
            auVar23 = vsqrtsd_avx(auVar23,auVar23);
            dVar25 = auVar23._0_8_;
          }
          dVar25 = 1.0 / dVar25;
          local_d8 = auVar44._0_8_;
          dStack_d0 = auVar44._8_8_;
          auVar17._8_8_ = dVar52;
          auVar17._0_8_ = dVar52;
          auVar34._8_8_ = 0;
          auVar34._0_8_ = auVar55._0_8_ * dVar25;
          auVar47._0_8_ = auVar46._0_8_ * dVar25 * local_d8;
          auVar47._8_8_ = auVar46._0_8_ * dVar25 * dStack_d0;
          auVar43._0_8_ = auVar42._0_8_ * dVar25 * local_d8;
          auVar43._8_8_ = auVar42._0_8_ * dVar25 * dStack_d0;
          auVar23 = vdivpd_avx(auVar47,auVar17);
          auVar31 = vdivpd_avx(auVar43,auVar17);
          auVar23 = vshufpd_avx(auVar23,auVar23,1);
          auVar23 = vaddsubpd_avx(auVar31,auVar23);
          p->ux = (double)auVar23._0_8_;
          p->uy = (double)auVar23._8_8_;
        }
        auVar31 = vshufpd_avx(auVar23,auVar23,1);
        p->uz = auVar34._0_8_;
        auVar49._8_8_ = 0;
        auVar49._0_8_ = auVar31._0_8_ * auVar31._0_8_;
        auVar5 = vfmadd231sd_fma(auVar49,auVar23,auVar23);
        auVar23 = vfmadd213sd_fma(auVar23,auVar23,ZEXT816(0x3ff0000000000000));
        auVar23 = vfmadd231sd_fma(auVar23,auVar31,auVar31);
        auVar24._0_8_ =
             (ulong)((byte)uVar12 & 1) * auVar23._0_8_ +
             (ulong)!(bool)((byte)uVar12 & 1) * auVar5._0_8_;
        auVar24._8_8_ = auVar5._8_8_;
        auVar23 = vfmadd231sd_fma(auVar24,auVar34,auVar34);
        auVar23 = vsqrtsd_avx(auVar23,auVar23);
        p->g = auVar23._0_8_;
        p->chi = 0.0;
        p->trn = 0;
        place(this,p);
        iVar18 = b->k;
      }
      iVar21 = b->j;
    }
    iVar19 = b->i;
    in_XMM9_Qb = uVar59;
  }
  pcVar7 = (this->cp).p._M_t.super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>._M_t.
           super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>.
           super__Head_base<0UL,_cellp_***,_false>._M_head_impl[a->i][a->j];
  pcVar7[a->k].pl.start = pcVar7[a->k].pl.head;
  return;
}

Assistant:

void spatial_region::fill_cell_by_particles(double cmr, int_vector3d& a, int_vector3d& b, double n, double ux0, double uy0, double dsplmt, double T)
{
    // a = {i,j,k} - cell position, b = {xnpic,ynpic,znpic}, n - density
    double x0;
    double y0;
    double z0;
    double q0;
    particle* tmp_p;
    x0 = 0.5/b.i + dsplmt;
    y0 = 0.5/b.j;
    z0 = 0.5/b.k;
    q0 = 1/double(b.i*b.j*b.k)*n;
    if (cmr<0) q0 = -q0;
    for(int ip=0;ip<b.i;ip++)
    {
        for(int jp=0;jp<b.j;jp++)
        {
            for(int kp=0;kp<b.k;kp++)
            {
                tmp_p = new_particle();
                // initial conditions
                tmp_p->cmr = cmr;
                tmp_p->q = q0;
                tmp_p->x = x0 + double(a.i) + double(ip)/double(b.i);
                tmp_p->y = y0 + double(a.j) + double(jp)/double(b.j);
                tmp_p->z = z0 + double(a.k) + double(kp)/double(b.k);
                if ( T!=0 && cmr!=0 ){
                    double u0 = sqrt( ux0*ux0 + uy0*uy0 );
                    double v0 = u0 / sqrt( 1 + u0*u0 );
                    double a, b, c, r, gamma, v;
                    // gives gamma with approximately e^(-(x-1)/T) distribution
                    do {
                        gamma = 1 + get_rand() * 5 * T;
                    } while ( get_rand() > exp( -(gamma - 1) / T));
                    // gives random direction (uniform)
                    do {
                        a = 2*get_rand()-1;
                        b = 2*get_rand()-1;
                        c = 2*get_rand()-1;
                        r = sqrt( a*a + b*b + c*c );
                    } while ( r > 1 || r == 0);
                    a = a / r;
                    b = b / r;
                    c = c / r;
                    // (a, b, c) now is the random vector uniformly distributed on a unit
                    // sphere
                    v = sqrt(1 - 1 / (gamma * gamma));
                    a = v * a; // vx'
                    b = v * b; // vy'
                    c = v * c; // vz'
                    // Lorentz transformation to lab reference frame
                    b = b*sqrt( 1 - v0*v0 )/( 1 + a*v0 );
                    c = c*sqrt( 1 - v0*v0 )/( 1 + a*v0 );
                    a = ( a + v0 )/( 1 + a*v0 );
                    double g = 1/sqrt( 1 - a*a - b*b - c*c );
                    tmp_p->ux = a*g*ux0/u0 - b*g*uy0/u0;
                    tmp_p->uy = a*g*uy0/u0 + b*g*ux0/u0;
                    tmp_p->uz = c*g;
                } else {
                    tmp_p->ux = ux0;
                    tmp_p->uy = uy0;
                    tmp_p->uz = 0;
                }
                if (cmr!=0)
                    tmp_p->g = sqrt(1 + (*tmp_p).ux*(*tmp_p).ux + (*tmp_p).uy*(*tmp_p).uy + (*tmp_p).uz*(*tmp_p).uz);
                else
                    tmp_p->g = sqrt((*tmp_p).ux*(*tmp_p).ux + (*tmp_p).uy*(*tmp_p).uy + (*tmp_p).uz*(*tmp_p).uz);
                #ifndef QUILL_NOQED
                tmp_p->chi = 0;
                #endif
                tmp_p->trn = 0;
                place(*tmp_p);
            }
        }
    }
    cp[a.i][a.j][a.k].pl.start = cp[a.i][a.j][a.k].pl.head;
}